

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

int udp_pipe_start(udp_pipe *p,udp_ep *ep,nng_sockaddr *sa)

{
  uint32_t uVar1;
  int iVar2;
  nni_time nVar3;
  int local_3c;
  nng_duration local_2c;
  nni_time now;
  nng_sockaddr *sa_local;
  udp_ep *ep_local;
  udp_pipe *p_local;
  
  nVar3 = nni_clock();
  p->ep = ep;
  p->proto = ep->proto;
  memcpy(&p->peer_addr,sa,0x88);
  p->dialer = (_Bool)(ep->dialer & 1);
  if ((p->dialer & 1U) == 0) {
    local_2c = ep->refresh;
  }
  else {
    local_2c = 200;
  }
  p->refresh = local_2c;
  p->rcvmax = ep->rcvmax;
  uVar1 = nni_random();
  p->self_seq = uVar1;
  if ((p->dialer & 1U) == 0) {
    local_3c = p->refresh * 5;
  }
  else {
    local_3c = 5000;
  }
  p->expire = nVar3 + (long)local_3c;
  iVar2 = nni_id_alloc32(&ep->pipes,&p->self_id,p);
  return iVar2;
}

Assistant:

static int
udp_pipe_start(udp_pipe *p, udp_ep *ep, nng_sockaddr *sa)
{
	nni_time now = nni_clock();
	p->ep        = ep;
	p->proto     = ep->proto;
	p->peer_addr = *sa;
	p->dialer    = ep->dialer;
	p->refresh   = p->dialer ? NNG_UDP_CONNRETRY : ep->refresh;
	p->rcvmax    = ep->rcvmax;
	p->self_seq  = nni_random();
	p->expire = now + (p->dialer ? (5 * NNI_SECOND) : UDP_PIPE_TIMEOUT(p));
	return (nni_id_alloc32(&ep->pipes, &p->self_id, p));
}